

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GLSL420Pack::ConstAssignmentTest::prepareNextTestCase
          (ConstAssignmentTest *this,GLuint test_case_index)

{
  this->m_current_test_case_index = test_case_index;
  return test_case_index + 1 < 3;
}

Assistant:

bool ConstAssignmentTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		return true;
	}
	else if (2 <= test_case_index)
	{
		return false;
	}

	return true;
}